

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIEnvironment.cpp
# Opt level: O0

IGUIElement * __thiscall
irr::gui::CGUIEnvironment::getNextElement(CGUIEnvironment *this,bool reverse,bool group)

{
  byte bVar1;
  bool bVar2;
  IGUIElement *pIVar3;
  byte bVar4;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  IGUIElement *first;
  IGUIElement *closest;
  IGUIElement *el;
  s32 startOrder;
  IGUIElement *startPos;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  IGUIElement *local_50;
  IGUIElement *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  s32 sVar5;
  undefined6 in_stack_ffffffffffffffe8;
  IGUIElement *local_8;
  
  bVar4 = in_SIL & 1;
  bVar1 = in_DL & 1;
  if (*(long *)(in_RDI + 0x1b0) == 0) {
    local_50 = (IGUIElement *)0x0;
  }
  else {
    local_50 = IGUIElement::getTabGroup
                         ((IGUIElement *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  }
  sVar5 = -1;
  if (((bVar1 & 1) == 0) || (local_50 == (IGUIElement *)0x0)) {
    if (((bVar1 & 1) == 0) &&
       (((*(long *)(in_RDI + 0x1b0) != 0 &&
         (bVar2 = IGUIElement::isTabGroup(*(IGUIElement **)(in_RDI + 0x1b0)), !bVar2)) &&
        (sVar5 = IGUIElement::getTabOrder(*(IGUIElement **)(in_RDI + 0x1b0)), sVar5 == -1)))) {
      in_stack_ffffffffffffffd0 = *(IGUIElement **)(in_RDI + 0x1b0);
      while( true ) {
        bVar2 = false;
        if (in_stack_ffffffffffffffd0 != (IGUIElement *)0x0) {
          pIVar3 = IGUIElement::getParent(in_stack_ffffffffffffffd0);
          bVar2 = false;
          if (pIVar3 != (IGUIElement *)0x0) {
            bVar2 = sVar5 == -1;
          }
        }
        if (!bVar2) break;
        in_stack_ffffffffffffffd0 = IGUIElement::getParent(in_stack_ffffffffffffffd0);
        sVar5 = IGUIElement::getTabOrder(in_stack_ffffffffffffffd0);
      }
    }
  }
  else {
    sVar5 = IGUIElement::getTabOrder(local_50);
  }
  if (((bVar1 & 1) != 0) || (local_50 == (IGUIElement *)0x0)) {
    local_50 = (IGUIElement *)(in_RDI + 8);
  }
  local_8 = (IGUIElement *)0x0;
  IGUIElement::getNextElement
            ((IGUIElement *)CONCAT17(bVar4,CONCAT16(bVar1,in_stack_ffffffffffffffe8)),
             (s32)((ulong)local_50 >> 0x20),SUB81((ulong)local_50 >> 0x18,0),
             SUB81((ulong)local_50 >> 0x10,0),
             (IGUIElement **)CONCAT44(sVar5,in_stack_ffffffffffffffd8),
             (IGUIElement **)in_stack_ffffffffffffffd0,false,false);
  if (local_8 == (IGUIElement *)0x0) {
    if ((bVar1 & 1) == 0) {
      local_8 = (IGUIElement *)0x0;
    }
    else {
      local_8 = (IGUIElement *)(in_RDI + 8);
    }
  }
  return local_8;
}

Assistant:

IGUIElement *CGUIEnvironment::getNextElement(bool reverse, bool group)
{
	// start the search at the root of the current tab group
	IGUIElement *startPos = Focus ? Focus->getTabGroup() : 0;
	s32 startOrder = -1;

	// if we're searching for a group
	if (group && startPos) {
		startOrder = startPos->getTabOrder();
	} else if (!group && Focus && !Focus->isTabGroup()) {
		startOrder = Focus->getTabOrder();
		if (startOrder == -1) {
			// this element is not part of the tab cycle,
			// but its parent might be...
			IGUIElement *el = Focus;
			while (el && el->getParent() && startOrder == -1) {
				el = el->getParent();
				startOrder = el->getTabOrder();
			}
		}
	}

	if (group || !startPos)
		startPos = this; // start at the root

	// find the element
	IGUIElement *closest = 0;
	IGUIElement *first = 0;
	startPos->getNextElement(startOrder, reverse, group, first, closest, false, (FocusFlags & EFF_CAN_FOCUS_DISABLED) != 0);

	if (closest)
		return closest; // we found an element
	else if (first)
		return first; // go to the end or the start
	else if (group)
		return this; // no group found? root group
	else
		return 0;
}